

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_geom_buf.cxx
# Opt level: O0

void __thiscall
xray_re::xr_vbuf::load_d3d9(xr_vbuf *this,xr_reader *r,size_t n,d3d_vertex_element *ve,size_t n_ve)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  fvector3 *pfVar6;
  fvector2 *pfVar7;
  ulong uVar8;
  fcolor *pfVar9;
  bool bVar10;
  float fVar11;
  fvector2 *local_98;
  size_t local_60;
  size_t j;
  size_t sStack_50;
  uint tc;
  size_t i_1;
  float local_40;
  fvector2 uv_fix;
  uint type;
  size_t i;
  size_t n_ve_local;
  d3d_vertex_element *ve_local;
  size_t n_local;
  xr_reader *r_local;
  xr_vbuf *this_local;
  
  clear(this);
  stack0xffffffffffffffc8 = 0;
  do {
    if (stack0xffffffffffffffc8 == n_ve) {
      xr_flexbuf::set_size(&this->super_xr_flexbuf,n);
      for (sStack_50 = 0; sStack_50 != n; sStack_50 = sStack_50 + 1) {
        j._4_4_ = 0;
        _vector2<float>::set((_vector2<float> *)((long)&i_1 + 4),0.0,0.0);
        for (local_60 = 0; local_60 != n_ve; local_60 = local_60 + 1) {
          switch(ve[local_60].usage) {
          case '\0':
            xr_reader::r_fvector3(r,this->m_points + sStack_50);
            break;
          case '\x03':
            r_qnormal(r,this->m_normals + sStack_50);
            break;
          case '\x05':
            if (ve[local_60].type == '\x01') {
              j._4_4_ = j._4_4_ + 1;
              if (j._4_4_ == 1) {
                local_98 = this->m_texcoords;
              }
              else {
                local_98 = this->m_lightmaps;
              }
              local_98 = local_98 + sStack_50;
              xr_reader::r_fvector2(r,local_98);
            }
            else if (ve[local_60].type == '\x06') {
              j._4_4_ = j._4_4_ + 1;
              if (j._4_4_ == 1) {
                r_qtexcoord(r,this->m_texcoords + sStack_50);
              }
              else {
                r_qlightmap(r,this->m_lightmaps + sStack_50);
              }
            }
            else {
              r_qtexcoord(r,this->m_texcoords + sStack_50);
              xr_reader::advance(r,4);
            }
            break;
          case '\x06':
            xr_reader::advance(r,3);
            fVar11 = xr_reader::r_float_q8(r,0.0,1.0);
            i_1._4_4_ = fVar11 * 0.0009765625;
            break;
          case '\a':
            xr_reader::advance(r,3);
            local_40 = xr_reader::r_float_q8(r,0.0,1.0);
            local_40 = local_40 * 0.0009765625;
            break;
          case '\n':
            r_qcolor(r,this->m_colors + sStack_50);
          }
        }
        if (this->m_texcoords != (fvector2 *)0x0) {
          this->m_texcoords[sStack_50].field_0.field_0.x =
               i_1._4_4_ + this->m_texcoords[sStack_50].field_0.field_0.x;
          this->m_texcoords[sStack_50].field_0.field_0.y =
               local_40 + this->m_texcoords[sStack_50].field_0.field_0.y;
        }
      }
      make_signature(this);
      return;
    }
    uv_fix.field_0.field_0.x = (float)(uint)ve[stack0xffffffffffffffc8].type;
    switch(ve[stack0xffffffffffffffc8].usage) {
    case '\0':
      if (uv_fix.field_0.field_0.x != 2.8026e-45) {
        __assert_fail("type == D3D_VE_TYPE_FLOAT3",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_geom_buf.cxx"
                      ,0xa2,
                      "void xray_re::xr_vbuf::load_d3d9(xr_reader &, size_t, const d3d_vertex_element *, size_t)"
                     );
      }
      if (this->m_points != (fvector3 *)0x0) {
        __assert_fail("m_points == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_geom_buf.cxx"
                      ,0xa3,
                      "void xray_re::xr_vbuf::load_d3d9(xr_reader &, size_t, const d3d_vertex_element *, size_t)"
                     );
      }
      auVar1._8_8_ = 0;
      auVar1._0_8_ = n;
      uVar8 = SUB168(auVar1 * ZEXT816(0xc),0);
      if (SUB168(auVar1 * ZEXT816(0xc),8) != 0) {
        uVar8 = 0xffffffffffffffff;
      }
      pfVar6 = (fvector3 *)operator_new__(uVar8);
      this->m_points = pfVar6;
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_geom_buf.cxx"
                    ,0xc1,
                    "void xray_re::xr_vbuf::load_d3d9(xr_reader &, size_t, const d3d_vertex_element *, size_t)"
                   );
    case '\x03':
      if (uv_fix.field_0.field_0.x != 5.60519e-45) {
        __assert_fail("type == D3D_VE_TYPE_D3DCOLOR",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_geom_buf.cxx"
                      ,0xa8,
                      "void xray_re::xr_vbuf::load_d3d9(xr_reader &, size_t, const d3d_vertex_element *, size_t)"
                     );
      }
      if (this->m_normals != (fvector3 *)0x0) {
        __assert_fail("m_normals == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_geom_buf.cxx"
                      ,0xa9,
                      "void xray_re::xr_vbuf::load_d3d9(xr_reader &, size_t, const d3d_vertex_element *, size_t)"
                     );
      }
      auVar2._8_8_ = 0;
      auVar2._0_8_ = n;
      uVar8 = SUB168(auVar2 * ZEXT816(0xc),0);
      if (SUB168(auVar2 * ZEXT816(0xc),8) != 0) {
        uVar8 = 0xffffffffffffffff;
      }
      pfVar6 = (fvector3 *)operator_new__(uVar8);
      this->m_normals = pfVar6;
      break;
    case '\x05':
      bVar10 = true;
      if ((uv_fix.field_0.field_0.x != 8.40779e-45) &&
         (bVar10 = true, uv_fix.field_0.field_0.x != 9.80909e-45)) {
        bVar10 = uv_fix.field_0.field_0.x == 1.4013e-45;
      }
      if (!bVar10) {
        __assert_fail("type == D3D_VE_TYPE_SHORT2 || type == D3D_VE_TYPE_SHORT4 || type == D3D_VE_TYPE_FLOAT2"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_geom_buf.cxx"
                      ,0xae,
                      "void xray_re::xr_vbuf::load_d3d9(xr_reader &, size_t, const d3d_vertex_element *, size_t)"
                     );
      }
      if (this->m_texcoords == (fvector2 *)0x0) {
        auVar3._8_8_ = 0;
        auVar3._0_8_ = n;
        uVar8 = SUB168(auVar3 * ZEXT816(8),0);
        if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
          uVar8 = 0xffffffffffffffff;
        }
        pfVar7 = (fvector2 *)operator_new__(uVar8);
        this->m_texcoords = pfVar7;
      }
      else {
        auVar4._8_8_ = 0;
        auVar4._0_8_ = n;
        uVar8 = SUB168(auVar4 * ZEXT816(8),0);
        if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
          uVar8 = 0xffffffffffffffff;
        }
        pfVar7 = (fvector2 *)operator_new__(uVar8);
        this->m_lightmaps = pfVar7;
      }
      break;
    case '\x06':
    case '\a':
      if (uv_fix.field_0.field_0.x != 5.60519e-45) {
        __assert_fail("type == D3D_VE_TYPE_D3DCOLOR",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_geom_buf.cxx"
                      ,0xb7,
                      "void xray_re::xr_vbuf::load_d3d9(xr_reader &, size_t, const d3d_vertex_element *, size_t)"
                     );
      }
      break;
    case '\n':
      if (uv_fix.field_0.field_0.x != 5.60519e-45) {
        __assert_fail("type == D3D_VE_TYPE_D3DCOLOR",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_geom_buf.cxx"
                      ,0xbb,
                      "void xray_re::xr_vbuf::load_d3d9(xr_reader &, size_t, const d3d_vertex_element *, size_t)"
                     );
      }
      if (this->m_colors != (fcolor *)0x0) {
        __assert_fail("m_colors == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_geom_buf.cxx"
                      ,0xbc,
                      "void xray_re::xr_vbuf::load_d3d9(xr_reader &, size_t, const d3d_vertex_element *, size_t)"
                     );
      }
      auVar5._8_8_ = 0;
      auVar5._0_8_ = n;
      uVar8 = SUB168(auVar5 * ZEXT816(0x10),0);
      if (SUB168(auVar5 * ZEXT816(0x10),8) != 0) {
        uVar8 = 0xffffffffffffffff;
      }
      pfVar9 = (fcolor *)operator_new__(uVar8);
      this->m_colors = pfVar9;
    }
    register0x00000000 = stack0xffffffffffffffc8 + 1;
  } while( true );
}

Assistant:

void xr_vbuf::load_d3d9(xr_reader& r, size_t n, const d3d_vertex_element ve[], size_t n_ve)
{
	clear();

	// validate vertex elements and create buffers
	for (size_t i = 0; i != n_ve; ++i) {
		unsigned type = ve[i].type;
		switch (ve[i].usage) {
		case D3D_VE_USAGE_POSITION:
			xr_assert(type == D3D_VE_TYPE_FLOAT3);
			xr_assert(m_points == 0);
			m_points = new fvector3[n];
			break;

		case D3D_VE_USAGE_NORMAL:
			xr_assert(type == D3D_VE_TYPE_D3DCOLOR);
			xr_assert(m_normals == 0);
			m_normals = new fvector3[n];
			break;

		case D3D_VE_USAGE_TEXCOORD:
			xr_assert(type == D3D_VE_TYPE_SHORT2 || type == D3D_VE_TYPE_SHORT4 || type == D3D_VE_TYPE_FLOAT2);
			if (m_texcoords == 0)
				m_texcoords = new fvector2[n];
			else
				m_lightmaps = new fvector2[n];
			break;

		case D3D_VE_USAGE_TANGENT:
		case D3D_VE_USAGE_BINORMAL:
			xr_assert(type == D3D_VE_TYPE_D3DCOLOR);
			break;

		case D3D_VE_USAGE_COLOR:
			xr_assert(type == D3D_VE_TYPE_D3DCOLOR);
			xr_assert(m_colors == 0);
			m_colors = new fcolor[n];
			break;

		default:
			xr_not_expected();
			break;
		}
	}

	fvector2 uv_fix;
	set_size(n);
	for (size_t i = 0; i != n; ++i) {
		unsigned tc = 0;
		uv_fix.set(0, 0);
		for (size_t j = 0; j != n_ve; ++j) {
			switch (ve[j].usage) {
			case D3D_VE_USAGE_POSITION:
				r.r_fvector3(m_points[i]);
				break;
			case D3D_VE_USAGE_NORMAL:
				r_qnormal(r, m_normals[i]);
				break;
			case D3D_VE_USAGE_TEXCOORD:
				switch (ve[j].type) {
				case D3D_VE_TYPE_FLOAT2:
					r.r_fvector2(++tc == 1 ? m_texcoords[i] : m_lightmaps[i]);
					break;
				case D3D_VE_TYPE_SHORT2:
					if (++tc == 1)
						r_qtexcoord(r, m_texcoords[i]);
					else
						r_qlightmap(r, m_lightmaps[i]);
					break;
				default:
				case D3D_VE_TYPE_SHORT4:
					r_qtexcoord(r, m_texcoords[i]);
					r.advance(2*sizeof(int16_t));
					break;
				}
				break;
			case D3D_VE_USAGE_TANGENT:
				r.advance(3*sizeof(uint8_t));
				uv_fix.x = r.r_float_q8()*(32.f/32768.f);
				break;
			case D3D_VE_USAGE_BINORMAL:
				r.advance(3*sizeof(uint8_t));
				uv_fix.y = r.r_float_q8()*(32.f/32768.f);
				break;
			case D3D_VE_USAGE_COLOR:
				r_qcolor(r, m_colors[i]);
				break;
			}
		}
		if (m_texcoords) {
			m_texcoords[i].x += uv_fix.x;
			m_texcoords[i].y += uv_fix.y;
		}
	}
	make_signature();
}